

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

QString * defaultTemplateName(void)

{
  long lVar1;
  QLatin1StringView other;
  bool bVar2;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> *in_RDI;
  long in_FS_OFFSET;
  QString baseName;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>
  *in_stack_fffffffffffffec8;
  QLatin1String *in_stack_fffffffffffffed0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> *a;
  QString *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff26;
  char *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  QString::QString((QString *)0x2f6848);
  QCoreApplication::applicationName();
  QString::operator=((QString *)in_stack_fffffffffffffed0,(QString *)in_stack_fffffffffffffec8);
  QString::~QString((QString *)0x2f6870);
  bVar2 = QString::isEmpty((QString *)0x2f687d);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_stack_fffffffffffffed0);
    other.m_size._6_2_ = in_stack_ffffffffffffff26;
    other.m_size._0_6_ = in_stack_ffffffffffffff20;
    other.m_data = in_stack_ffffffffffffff28;
    QString::operator=(in_stack_ffffffffffffff00,other);
  }
  QDir::tempPath();
  operator+((QString *)a,(char16_t *)in_stack_fffffffffffffed0);
  operator+(&a->a,(QString *)in_stack_fffffffffffffed0);
  Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_stack_fffffffffffffed0);
  operator+(a,in_stack_fffffffffffffed0);
  QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffec8);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>
                   *)0x2f6973);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> *)0x2f6980);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x2f698d);
  QString::~QString((QString *)0x2f6997);
  QString::~QString((QString *)0x2f69a4);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

static QString defaultTemplateName()
{
    QString baseName;
#if defined(QT_BUILD_CORE_LIB)
    baseName = QCoreApplication::applicationName();
    if (baseName.isEmpty())
#endif
        baseName = "qt_temp"_L1;

    return QDir::tempPath() + u'/' + baseName + "-XXXXXX"_L1;
}